

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O0

void SampleGrids(int64_t limit)

{
  result_type_conflict rVar1;
  char *grid_00;
  char *in_RDI;
  void *unaff_retaddr;
  size_t grid_id;
  char grid [81];
  void *index;
  void *table;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff78;
  uniform_int_distribution<unsigned_long> *in_stack_ffffffffffffff80;
  undefined1 local_78 [96];
  void *local_18;
  void *local_10;
  
  local_10 = MMapFile((char *)grid._0_8_);
  local_18 = MMapFile((char *)grid._0_8_);
  while (grid_00 = in_RDI + -1, in_RDI != (char *)0x0) {
    rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 = (uniform_int_distribution<unsigned_long> *)(rVar1 % 0x339a6ca6180);
    GetGrid(grid._0_8_,(void *)grid_id,unaff_retaddr,grid_00);
    printf("%.81s\t%zu\n",local_78,in_stack_ffffffffffffff80);
    in_RDI = grid_00;
  }
  return;
}

Assistant:

void SampleGrids(int64_t limit) {
    void *table = MMapFile("grid.counts");
    void *index = MMapFile("grid.index");

    char grid[81];
    while (limit-- != 0) {
        size_t grid_id = random_uint(rng) % num_equivalence_classes;
        GetGrid(grid_id, index, table, grid);
        printf("%.81s\t%zu\n", grid, grid_id);
    }
}